

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.cpp
# Opt level: O0

bool __thiscall ftxui::anon_unknown_3::ButtonBase::OnEvent(ButtonBase *this,Event *event)

{
  int x;
  bool bVar1;
  Mouse *pMVar2;
  unique_ptr<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>_>
  local_28;
  Event *local_20;
  Event *event_local;
  ButtonBase *this_local;
  
  local_20 = event;
  event_local = (Event *)this;
  bVar1 = Event::is_mouse(event);
  if (bVar1) {
    pMVar2 = Event::mouse(event);
    x = pMVar2->x;
    pMVar2 = Event::mouse(event);
    bVar1 = Box::Contain(&this->box_,x,pMVar2->y);
    if (bVar1) {
      ComponentBase::CaptureMouse((ComponentBase *)&local_28,(Event *)this);
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_28);
      std::
      unique_ptr<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>_>
      ::~unique_ptr(&local_28);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        return false;
      }
      ComponentBase::TakeFocus(&this->super_ComponentBase);
      pMVar2 = Event::mouse(event);
      if ((pMVar2->button == Left) && (pMVar2 = Event::mouse(event), pMVar2->motion == Pressed)) {
        std::function<void_()>::operator()(&this->on_click_);
        return true;
      }
      return false;
    }
  }
  bVar1 = Event::operator==(event,(Event *)Event::Return);
  if (bVar1) {
    std::function<void_()>::operator()(&this->on_click_);
  }
  return bVar1;
}

Assistant:

bool OnEvent(Event event) override {
    if (event.is_mouse() && box_.Contain(event.mouse().x, event.mouse().y)) {
      if (!CaptureMouse(event))
        return false;

      TakeFocus();

      if (event.mouse().button == Mouse::Left &&
          event.mouse().motion == Mouse::Pressed) {
        on_click_();
        return true;
      }

      return false;
    }

    if (event == Event::Return) {
      on_click_();
      return true;
    }
    return false;
  }